

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O3

void __thiscall cmCursesOptionsWidget::SetOption(cmCursesOptionsWidget *this,string *value)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  size_type sVar3;
  pointer pbVar4;
  
  this->CurrentOption = 0;
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])();
  pbVar4 = (this->Options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    __s2 = (value->_M_dataplus)._M_p;
    __n = value->_M_string_length;
    sVar3 = 0;
    do {
      if (pbVar4->_M_string_length == __n) {
        if (__n != 0) {
          iVar2 = bcmp((pbVar4->_M_dataplus)._M_p,__s2,__n);
          if (iVar2 != 0) goto LAB_0021e444;
        }
        this->CurrentOption = sVar3;
      }
LAB_0021e444:
      sVar3 = sVar3 + 1;
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  return;
}

Assistant:

void cmCursesOptionsWidget::SetOption(const std::string& value)
{
  this->CurrentOption = 0; // default to 0 index
  this->SetValue(value);
  int index = 0;
  for(std::vector<std::string>::iterator i = this->Options.begin();
      i != this->Options.end(); ++i)
    {
    if(*i == value)
      {
      this->CurrentOption = index;
      }
    index++;
    }
}